

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  value_type *ppIVar3;
  ImGuiWindow *local_20;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  Columns(1,"#CloseColumns",true);
  PopClipRect();
  if ((window_00->Flags & 0x100000U) == 0) {
    LogFinish();
  }
  ImVector<ImGuiWindow_*>::pop_back(&pIVar1->CurrentWindowStack);
  if ((window_00->Flags & 0x2000000U) != 0) {
    ImVector<ImGuiPopupRef>::pop_back(&pIVar1->CurrentPopupStack);
  }
  CheckStacksSize(window_00,false);
  bVar2 = ImVector<ImGuiWindow_*>::empty(&pIVar1->CurrentWindowStack);
  if (bVar2) {
    local_20 = (ImGuiWindow *)0x0;
  }
  else {
    ppIVar3 = ImVector<ImGuiWindow_*>::back(&pIVar1->CurrentWindowStack);
    local_20 = *ppIVar3;
  }
  SetCurrentWindow(local_20);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    Columns(1, "#CloseColumns");
    PopClipRect();   // inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop
    // NB: we don't clear 'window->RootWindow'. The pointer is allowed to live until the next call to Begin().
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.CurrentPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}